

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall xemmai::t_emit::f_at(t_emit *this,t_node *a_node)

{
  t_code *ptVar1;
  value_type local_38;
  t_node *local_18;
  t_node *a_node_local;
  t_emit *this_local;
  
  ptVar1 = this->v_code;
  local_38.super_t_at.v_position = (a_node->v_at).v_position;
  local_38.super_t_at.v_line = (a_node->v_at).v_line;
  local_38.super_t_at.v_column = (a_node->v_at).v_column;
  local_18 = a_node;
  a_node_local = (t_node *)this;
  local_38.v_address = f_last(this);
  std::vector<xemmai::t_code::t_at_address,_std::allocator<xemmai::t_code::t_at_address>_>::
  push_back(&ptVar1->v_ats,&local_38);
  return;
}

Assistant:

void f_at(ast::t_node* a_node)
	{
		v_code->v_ats.push_back({a_node->v_at, f_last()});
	}